

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_MissingValueMoreThan_Test::~TApp_MissingValueMoreThan_Test
          (TApp_MissingValueMoreThan_Test *this)

{
  TApp_MissingValueMoreThan_Test *this_local;
  
  ~TApp_MissingValueMoreThan_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, MissingValueMoreThan) {
    std::vector<int> vals1;
    std::vector<int> vals2;
    app.add_option("-v", vals1)->expected(-2);
    app.add_option("--vals", vals2)->expected(-2);

    args = {"-v", "2"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"--vals", "4"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}